

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoMocUic.cxx
# Opt level: O0

SourceFileHandleT __thiscall
cmQtAutoMocUic::JobEvaluateT::MocFindIncludedHeader
          (JobEvaluateT *this,string *includerDir,string *includeBase)

{
  bool bVar1;
  MocSettingsT *pMVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  SourceFileHandleT SVar4;
  string local_a0 [8];
  string testPath;
  string *path;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  byte local_29;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  string *includeBase_local;
  string *includerDir_local;
  JobEvaluateT *this_local;
  SourceFileHandleT *res;
  
  local_29 = 0;
  local_28 = in_RCX;
  includeBase_local = includeBase;
  includerDir_local = includerDir;
  this_local = this;
  std::operator+(&local_50,includeBase,in_RCX);
  MocFindHeader(this,includerDir);
  std::__cxx11::string::~string((string *)&local_50);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)this);
  if (bVar1) {
    local_29 = 1;
  }
  _Var3._M_pi = extraout_RDX;
  if ((local_29 & 1) == 0) {
    std::shared_ptr<cmQtAutoMocUic::SourceFileT>::~shared_ptr
              ((shared_ptr<cmQtAutoMocUic::SourceFileT> *)this);
    _Var3._M_pi = extraout_RDX_00;
  }
  if (!bVar1) {
    pMVar2 = JobT::MocConst((JobT *)includerDir);
    __end1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&pMVar2->IncludePaths);
    path = (string *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&pMVar2->IncludePaths);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&path), bVar1) {
      testPath.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&__end1);
      std::__cxx11::string::string(local_a0,(string *)testPath.field_2._8_8_);
      std::__cxx11::string::operator+=(local_a0,'/');
      std::__cxx11::string::operator+=(local_a0,(string *)local_28);
      MocFindHeader(this,includerDir);
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)this);
      if (!bVar1) {
        std::shared_ptr<cmQtAutoMocUic::SourceFileT>::~shared_ptr
                  ((shared_ptr<cmQtAutoMocUic::SourceFileT> *)this);
      }
      std::__cxx11::string::~string(local_a0);
      _Var3._M_pi = extraout_RDX_01;
      if (bVar1) goto LAB_001fb235;
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
    std::shared_ptr<cmQtAutoMocUic::SourceFileT>::shared_ptr
              ((shared_ptr<cmQtAutoMocUic::SourceFileT> *)this);
    _Var3._M_pi = extraout_RDX_02;
  }
LAB_001fb235:
  SVar4.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var3._M_pi;
  SVar4.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (SourceFileHandleT)
         SVar4.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

cmQtAutoMocUic::SourceFileHandleT
cmQtAutoMocUic::JobEvaluateT::MocFindIncludedHeader(
  std::string const& includerDir, std::string const& includeBase) const
{
  // Search in vicinity of the source
  {
    SourceFileHandleT res = MocFindHeader(includerDir + includeBase);
    if (res) {
      return res;
    }
  }
  // Search in include directories
  for (std::string const& path : MocConst().IncludePaths) {
    std::string testPath = path;
    testPath += '/';
    testPath += includeBase;
    SourceFileHandleT res = MocFindHeader(testPath);
    if (res) {
      return res;
    }
  }
  // Return without success
  return SourceFileHandleT();
}